

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledRgba.cpp
# Opt level: O0

void anon_unknown.dwarf_24c551::writeReadIncomplete(string *tempDir)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  Rgba *pRVar4;
  char *pcVar5;
  undefined4 *puVar6;
  void *pvVar7;
  int *piVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  Rgba *t_1;
  Rgba *s_1;
  int x_4;
  int y_4;
  InputExc *anon_var_0_2;
  IoExc *anon_var_0_3;
  bool tilesBroken;
  bool tilesMissing;
  int tileY_3;
  Box2i *dw_1;
  TiledRgbaInputFile in_1;
  int x_3;
  int y_3;
  Array2D<Imf_3_4::Rgba> p2_1;
  Rgba *t;
  Rgba *s;
  int tileX_2;
  int x_2;
  int tileY_2;
  int y_2;
  InputExc *anon_var_0;
  IoExc *anon_var_0_1;
  bool tileBroken;
  bool tilePresent;
  int tileX_1;
  int tileY_1;
  Box2i *dw;
  TiledRgbaInputFile in;
  int x_1;
  int y_1;
  Array2D<Imf_3_4::Rgba> p2;
  int tileX;
  int tileY;
  TiledRgbaOutputFile out;
  Header header;
  int x;
  int y;
  Array2D<Imf_3_4::Rgba> p1;
  int tileYSize;
  int tileXSize;
  int height;
  int width;
  string fileName;
  float in_stack_fffffffffffffcbc;
  undefined4 in_stack_fffffffffffffcc0;
  undefined4 uVar12;
  undefined4 in_stack_fffffffffffffcc4;
  undefined4 in_stack_fffffffffffffce0;
  undefined2 in_stack_fffffffffffffce4;
  undefined1 in_stack_fffffffffffffce6;
  undefined1 in_stack_fffffffffffffce7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  Array2D<Imf_3_4::Rgba> *in_stack_fffffffffffffd10;
  int local_218;
  int local_214;
  int local_1fc;
  Rgba local_1f0 [7];
  half local_1b8;
  half local_1b6;
  half local_1b4;
  half local_1b2;
  Rgba local_1b0;
  int local_1a8;
  int local_1a4;
  Array2D<Imf_3_4::Rgba> local_1a0;
  Rgba *local_188;
  Rgba *local_180;
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  byte local_152;
  byte local_151;
  int local_150;
  int local_14c;
  int *local_148;
  Rgba local_140 [7];
  half local_108;
  half local_106;
  half local_104;
  half local_102;
  Rgba local_100;
  int local_f8;
  int local_f4;
  Array2D<Imf_3_4::Rgba> local_f0;
  int local_d8;
  int local_d4;
  Rgba local_d0 [3];
  Vec2<float> local_b8;
  Header local_b0 [60];
  half local_74;
  half local_72;
  half local_70;
  half local_6e;
  Rgba local_6c;
  int local_64;
  int local_60;
  Array2D<Imf_3_4::Rgba> local_50;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  string local_28 [40];
  
  poVar3 = std::operator<<((ostream *)&std::cout,"\nfile with missing and broken tiles");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::operator+(in_stack_fffffffffffffce8,
                 (char *)CONCAT17(in_stack_fffffffffffffce7,
                                  CONCAT16(in_stack_fffffffffffffce6,
                                           CONCAT24(in_stack_fffffffffffffce4,
                                                    in_stack_fffffffffffffce0))));
  local_2c = 400;
  local_30 = 300;
  local_34 = 0x1e;
  local_38 = 0x28;
  Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D
            (in_stack_fffffffffffffd10,CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08)
             ,CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
  for (local_60 = 0; local_60 < 300; local_60 = local_60 + 1) {
    for (local_64 = 0; local_64 < 400; local_64 = local_64 + 1) {
      Imath_3_2::half::half
                ((half *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                 in_stack_fffffffffffffcbc);
      Imath_3_2::half::half
                ((half *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                 in_stack_fffffffffffffcbc);
      Imath_3_2::half::half
                ((half *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                 in_stack_fffffffffffffcbc);
      Imath_3_2::half::half
                ((half *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                 in_stack_fffffffffffffcbc);
      Imf_3_4::Rgba::Rgba(&local_6c,local_6e,local_70,local_72,local_74);
      pRVar4 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_50,(long)local_60);
      pRVar4[local_64] = local_6c;
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"writing");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  remove(pcVar5);
  Imath_3_2::Vec2<float>::Vec2(&local_b8,0.0,0.0);
  Imf_3_4::Header::Header(local_b0,400,300,1.0,(Vec2 *)&local_b8,1.0,INCREASING_Y,ZIP_COMPRESSION);
  puVar6 = (undefined4 *)Imf_3_4::Header::lineOrder();
  *puVar6 = 2;
  pcVar5 = (char *)std::__cxx11::string::c_str();
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledRgbaOutputFile::TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)local_d0,pcVar5,local_b0,WRITE_RGBA,0x1e,0x28,ONE_LEVEL,
             ROUND_DOWN,iVar1);
  pRVar4 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_50,0);
  Imf_3_4::TiledRgbaOutputFile::setFrameBuffer(local_d0,(ulong)pRVar4,1);
  Imf_3_4::TiledRgbaOutputFile::writeTile((int)local_d0,0,0);
  for (local_d4 = 0; iVar1 = local_d4,
      iVar2 = Imf_3_4::TiledRgbaOutputFile::numYTiles((int)local_d0), iVar1 < iVar2;
      local_d4 = local_d4 + 1) {
    for (local_d8 = 0; iVar1 = local_d8,
        iVar2 = Imf_3_4::TiledRgbaOutputFile::numXTiles((int)local_d0), iVar1 < iVar2;
        local_d8 = local_d8 + 1) {
      if ((local_d8 + local_d4 & 1U) != 0) {
        Imf_3_4::TiledRgbaOutputFile::writeTile((int)local_d0,local_d8,local_d4);
      }
    }
  }
  Imf_3_4::TiledRgbaOutputFile::writeTile((int)local_d0,2,0);
  Imf_3_4::TiledRgbaOutputFile::breakTile((int)local_d0,0,0,0,0,0x19,'\n');
  uVar12 = 0xffffffff;
  Imf_3_4::TiledRgbaOutputFile::breakTile((int)local_d0,2,0,0,0,0x19,'\n');
  Imf_3_4::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)local_d0);
  Imf_3_4::Header::~Header(local_b0);
  Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D
            (in_stack_fffffffffffffd10,CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08)
             ,CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
  for (local_f4 = 0; local_f4 < 300; local_f4 = local_f4 + 1) {
    for (local_f8 = 0; local_f8 < 400; local_f8 = local_f8 + 1) {
      Imath_3_2::half::half
                ((half *)CONCAT44(in_stack_fffffffffffffcc4,uVar12),in_stack_fffffffffffffcbc);
      Imath_3_2::half::half
                ((half *)CONCAT44(in_stack_fffffffffffffcc4,uVar12),in_stack_fffffffffffffcbc);
      Imath_3_2::half::half
                ((half *)CONCAT44(in_stack_fffffffffffffcc4,uVar12),in_stack_fffffffffffffcbc);
      Imath_3_2::half::half
                ((half *)CONCAT44(in_stack_fffffffffffffcc4,uVar12),in_stack_fffffffffffffcbc);
      Imf_3_4::Rgba::Rgba(&local_100,local_102,local_104,local_106,local_108);
      pRVar4 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_f0,(long)local_f4);
      pRVar4[local_f8] = local_100;
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"reading one tile at a time,");
  std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)local_140,pcVar5,iVar1);
  local_148 = (int *)Imf_3_4::TiledRgbaInputFile::dataWindow();
  if (local_148[2] - *local_148 != 399) {
    __assert_fail("dw.max.x - dw.min.x + 1 == width",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                  ,0x217,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
  }
  if (local_148[3] - local_148[1] != 299) {
    __assert_fail("dw.max.y - dw.min.y + 1 == height",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                  ,0x218,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
  }
  if (*local_148 != 0) {
    __assert_fail("dw.min.x == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                  ,0x219,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
  }
  if (local_148[1] != 0) {
    __assert_fail("dw.min.y == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                  ,0x21a,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
  }
  pRVar4 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_f0,0);
  Imf_3_4::TiledRgbaInputFile::setFrameBuffer(local_140,(ulong)pRVar4,1);
  for (local_14c = 0; iVar1 = local_14c,
      iVar2 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)local_140), iVar1 < iVar2;
      local_14c = local_14c + 1) {
    for (local_150 = 0; iVar1 = local_150,
        iVar2 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)local_140), iVar1 < iVar2;
        local_150 = local_150 + 1) {
      local_151 = 1;
      local_152 = 0;
      Imf_3_4::TiledRgbaInputFile::readTile((int)local_140,local_150,local_14c);
      bVar9 = true;
      if ((local_152 & 1) == 0) {
        bVar9 = (uint)(local_151 & 1) == (local_150 + local_14c & 1U);
      }
      if (!bVar9) {
        __assert_fail("tileBroken || (tilePresent == ((tileX + tileY) & 1))",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                      ,0x232,"void (anonymous namespace)::writeReadIncomplete(const std::string &)")
        ;
      }
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout," comparing");
  pvVar7 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar7,std::flush<char,std::char_traits<char>>);
  for (local_16c = 0; local_16c < 300; local_16c = local_16c + 1) {
    local_170 = local_16c / 0x28;
    for (local_174 = 0; local_174 < 400; local_174 = local_174 + 1) {
      local_178 = local_174 / 0x1e;
      local_180 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_50,(long)local_16c);
      local_180 = local_180 + local_174;
      local_188 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_f0,(long)local_16c);
      local_188 = local_188 + local_174;
      if ((local_178 + local_170 & 1U) == 0) {
        fVar10 = Imath_3_2::half::operator_cast_to_float
                           ((half *)CONCAT44(in_stack_fffffffffffffcc4,uVar12));
        bVar9 = false;
        if ((fVar10 == -1.0) && (!NAN(fVar10))) {
          fVar10 = Imath_3_2::half::operator_cast_to_float
                             ((half *)CONCAT44(in_stack_fffffffffffffcc4,uVar12));
          bVar9 = false;
          if ((fVar10 == -1.0) && (!NAN(fVar10))) {
            fVar10 = Imath_3_2::half::operator_cast_to_float
                               ((half *)CONCAT44(in_stack_fffffffffffffcc4,uVar12));
            bVar9 = false;
            if ((fVar10 == -1.0) && (!NAN(fVar10))) {
              fVar10 = Imath_3_2::half::operator_cast_to_float
                                 ((half *)CONCAT44(in_stack_fffffffffffffcc4,uVar12));
              bVar9 = fVar10 == -1.0;
            }
          }
        }
        if (!bVar9) {
          __assert_fail("t.r == -1 && t.g == -1 && t.b == -1 && t.a == -1",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                        ,0x24a,
                        "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
        }
      }
      else {
        fVar10 = Imath_3_2::half::operator_cast_to_float
                           ((half *)CONCAT44(in_stack_fffffffffffffcc4,uVar12));
        fVar11 = Imath_3_2::half::operator_cast_to_float
                           ((half *)CONCAT44(in_stack_fffffffffffffcc4,uVar12));
        bVar9 = false;
        if ((fVar10 == fVar11) && (!NAN(fVar10) && !NAN(fVar11))) {
          fVar10 = Imath_3_2::half::operator_cast_to_float
                             ((half *)CONCAT44(in_stack_fffffffffffffcc4,uVar12));
          fVar11 = Imath_3_2::half::operator_cast_to_float
                             ((half *)CONCAT44(in_stack_fffffffffffffcc4,uVar12));
          bVar9 = false;
          if ((fVar10 == fVar11) && (!NAN(fVar10) && !NAN(fVar11))) {
            fVar10 = Imath_3_2::half::operator_cast_to_float
                               ((half *)CONCAT44(in_stack_fffffffffffffcc4,uVar12));
            fVar11 = Imath_3_2::half::operator_cast_to_float
                               ((half *)CONCAT44(in_stack_fffffffffffffcc4,uVar12));
            bVar9 = false;
            if ((fVar10 == fVar11) && (!NAN(fVar10) && !NAN(fVar11))) {
              fVar10 = Imath_3_2::half::operator_cast_to_float
                                 ((half *)CONCAT44(in_stack_fffffffffffffcc4,uVar12));
              fVar11 = Imath_3_2::half::operator_cast_to_float
                                 ((half *)CONCAT44(in_stack_fffffffffffffcc4,uVar12));
              bVar9 = fVar10 == fVar11;
            }
          }
        }
        if (!bVar9) {
          __assert_fail("t.r == s.r && t.g == s.g && t.b == s.b && t.a == s.a",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                        ,0x246,
                        "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
        }
      }
    }
  }
  Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)local_140);
  Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D
            ((Array2D<Imf_3_4::Rgba> *)CONCAT44(in_stack_fffffffffffffcc4,uVar12));
  Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D
            (in_stack_fffffffffffffd10,CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08)
             ,CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
  for (local_1a4 = 0; local_1a4 < 300; local_1a4 = local_1a4 + 1) {
    for (local_1a8 = 0; local_1a8 < 400; local_1a8 = local_1a8 + 1) {
      Imath_3_2::half::half
                ((half *)CONCAT44(in_stack_fffffffffffffcc4,uVar12),in_stack_fffffffffffffcbc);
      Imath_3_2::half::half
                ((half *)CONCAT44(in_stack_fffffffffffffcc4,uVar12),in_stack_fffffffffffffcbc);
      Imath_3_2::half::half
                ((half *)CONCAT44(in_stack_fffffffffffffcc4,uVar12),in_stack_fffffffffffffcbc);
      Imath_3_2::half::half
                ((half *)CONCAT44(in_stack_fffffffffffffcc4,uVar12),in_stack_fffffffffffffcbc);
      Imf_3_4::Rgba::Rgba(&local_1b0,local_1b2,local_1b4,local_1b6,local_1b8);
      pRVar4 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_1a0,(long)local_1a4);
      pRVar4[local_1a8] = local_1b0;
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"reading multiple tiles at a time,");
  std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)local_1f0,pcVar5,iVar1);
  piVar8 = (int *)Imf_3_4::TiledRgbaInputFile::dataWindow();
  if (piVar8[2] - *piVar8 != 399) {
    __assert_fail("dw.max.x - dw.min.x + 1 == width",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                  ,0x25c,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
  }
  if (piVar8[3] - piVar8[1] != 299) {
    __assert_fail("dw.max.y - dw.min.y + 1 == height",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                  ,0x25d,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
  }
  if (*piVar8 != 0) {
    __assert_fail("dw.min.x == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                  ,0x25e,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
  }
  if (piVar8[1] != 0) {
    __assert_fail("dw.min.y == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                  ,0x25f,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
  }
  pRVar4 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_1a0,0);
  Imf_3_4::TiledRgbaInputFile::setFrameBuffer(local_1f0,(ulong)pRVar4,1);
  local_1fc = 0;
  iVar1 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)local_1f0);
  if (local_1fc < iVar1) {
    iVar1 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)local_1f0);
    Imf_3_4::TiledRgbaInputFile::readTiles((int)local_1f0,0,iVar1 + -1,0,0);
    __assert_fail("tilesMissing || tilesBroken",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                  ,0x275,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
  }
  poVar3 = std::operator<<((ostream *)&std::cout," comparing");
  pvVar7 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar7,std::flush<char,std::char_traits<char>>);
  local_214 = 0;
  do {
    if (299 < local_214) {
      Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)local_1f0);
      Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D
                ((Array2D<Imf_3_4::Rgba> *)CONCAT44(in_stack_fffffffffffffcc4,uVar12));
      pcVar5 = (char *)std::__cxx11::string::c_str();
      remove(pcVar5);
      Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D
                ((Array2D<Imf_3_4::Rgba> *)CONCAT44(in_stack_fffffffffffffcc4,uVar12));
      std::__cxx11::string::~string(local_28);
      return;
    }
    for (local_218 = 0; local_218 < 400; local_218 = local_218 + 1) {
      Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_50,(long)local_214);
      Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_1a0,(long)local_214);
      fVar10 = Imath_3_2::half::operator_cast_to_float
                         ((half *)CONCAT44(in_stack_fffffffffffffcc4,uVar12));
      if ((fVar10 != -1.0) || (NAN(fVar10))) {
LAB_00216597:
        fVar10 = Imath_3_2::half::operator_cast_to_float
                           ((half *)CONCAT44(in_stack_fffffffffffffcc4,uVar12));
        fVar11 = Imath_3_2::half::operator_cast_to_float
                           ((half *)CONCAT44(in_stack_fffffffffffffcc4,uVar12));
        bVar9 = false;
        if ((fVar10 == fVar11) && (!NAN(fVar10) && !NAN(fVar11))) {
          fVar10 = Imath_3_2::half::operator_cast_to_float
                             ((half *)CONCAT44(in_stack_fffffffffffffcc4,uVar12));
          fVar11 = Imath_3_2::half::operator_cast_to_float
                             ((half *)CONCAT44(in_stack_fffffffffffffcc4,uVar12));
          bVar9 = false;
          if ((fVar10 == fVar11) && (!NAN(fVar10) && !NAN(fVar11))) {
            fVar10 = Imath_3_2::half::operator_cast_to_float
                               ((half *)CONCAT44(in_stack_fffffffffffffcc4,uVar12));
            fVar11 = Imath_3_2::half::operator_cast_to_float
                               ((half *)CONCAT44(in_stack_fffffffffffffcc4,uVar12));
            bVar9 = false;
            if ((fVar10 == fVar11) && (!NAN(fVar10) && !NAN(fVar11))) {
              fVar10 = Imath_3_2::half::operator_cast_to_float
                                 ((half *)CONCAT44(in_stack_fffffffffffffcc4,uVar12));
              fVar11 = Imath_3_2::half::operator_cast_to_float
                                 ((half *)CONCAT44(in_stack_fffffffffffffcc4,uVar12));
              bVar9 = fVar10 == fVar11;
            }
          }
        }
      }
      else {
        fVar10 = Imath_3_2::half::operator_cast_to_float
                           ((half *)CONCAT44(in_stack_fffffffffffffcc4,uVar12));
        if ((fVar10 != -1.0) || (NAN(fVar10))) goto LAB_00216597;
        fVar10 = Imath_3_2::half::operator_cast_to_float
                           ((half *)CONCAT44(in_stack_fffffffffffffcc4,uVar12));
        if ((fVar10 != -1.0) || (NAN(fVar10))) goto LAB_00216597;
        fVar10 = Imath_3_2::half::operator_cast_to_float
                           ((half *)CONCAT44(in_stack_fffffffffffffcc4,uVar12));
        bVar9 = true;
        if ((fVar10 != -1.0) || (NAN(fVar10))) goto LAB_00216597;
      }
      if (!bVar9) {
        __assert_fail("(t.r == -1 && t.g == -1 && t.b == -1 && t.a == -1) || (t.r == s.r && t.g == s.g && t.b == s.b && t.a == s.a)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                      ,0x283,"void (anonymous namespace)::writeReadIncomplete(const std::string &)")
        ;
      }
    }
    local_214 = local_214 + 1;
  } while( true );
}

Assistant:

void
writeReadIncomplete (const std::string& tempDir)
{
    cout << "\nfile with missing and broken tiles" << endl;

    std::string fileName = tempDir + "imf_test_tiled_incomplete.exr";

    //
    // Write a file where every other tile is missing or broken.
    // Then try read the file and verify that all existing good
    // tiles can actually be read.
    //

    const int width     = 400;
    const int height    = 300;
    const int tileXSize = 30;
    const int tileYSize = 40;

    Array2D<Rgba> p1 (height, width);

    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
            p1[y][x] = Rgba (x % 5, x % 17, y % 23, y % 29);

    {
        cout << "writing" << endl;

        remove (fileName.c_str ());

        Header header (width, height);
        header.lineOrder () = RANDOM_Y;

        TiledRgbaOutputFile out (
            fileName.c_str (),
            header,
            WRITE_RGBA,
            tileXSize,
            tileYSize,
            ONE_LEVEL);

        out.setFrameBuffer (&p1[0][0], 1, width);

        out.writeTile (0, 0);

        for (int tileY = 0; tileY < out.numYTiles (); ++tileY)
            for (int tileX = 0; tileX < out.numXTiles (); ++tileX)
                if ((tileX + tileY) & 1) out.writeTile (tileX, tileY);

        out.writeTile (2, 0);

        out.breakTile (0, 0, 0, 0, 25, 10, 0xff); // destroy tiles
        out.breakTile (2, 0, 0, 0, 25, 10, 0xff); // (0,0) and (2,0)
    }

    {
        Array2D<Rgba> p2 (height, width);

        for (int y = 0; y < height; ++y)
            for (int x = 0; x < width; ++x)
                p2[y][x] = Rgba (-1, -1, -1, -1);

        cout << "reading one tile at a time," << flush;

        TiledRgbaInputFile in (fileName.c_str ());
        const Box2i&       dw = in.dataWindow ();

        assert (dw.max.x - dw.min.x + 1 == width);
        assert (dw.max.y - dw.min.y + 1 == height);
        assert (dw.min.x == 0);
        assert (dw.min.y == 0);

        in.setFrameBuffer (&p2[0][0], 1, width);

        for (int tileY = 0; tileY < in.numYTiles (); ++tileY)
        {
            for (int tileX = 0; tileX < in.numXTiles (); ++tileX)
            {
                bool tilePresent = true;
                bool tileBroken  = false;

                try
                {
                    in.readTile (tileX, tileY);
                }
                catch (const IEX_NAMESPACE::InputExc&)
                {
                    tilePresent = false; // tile is missing
                }
                catch (const IEX_NAMESPACE::IoExc&)
                {
                    tileBroken = true; // tile cannot be decoded
                }

                assert (tileBroken || (tilePresent == ((tileX + tileY) & 1)));
            }
        }

        cout << " comparing" << endl << flush;

        for (int y = 0; y < height; ++y)
        {
            int tileY = y / tileYSize;

            for (int x = 0; x < width; ++x)
            {
                int tileX = x / tileXSize;

                const Rgba& s = p1[y][x];
                const Rgba& t = p2[y][x];

                if ((tileX + tileY) & 1)
                {
                    assert (
                        t.r == s.r && t.g == s.g && t.b == s.b && t.a == s.a);
                }
                else
                {
                    assert (t.r == -1 && t.g == -1 && t.b == -1 && t.a == -1);
                }
            }
        }
    }

    {
        Array2D<Rgba> p2 (height, width);

        for (int y = 0; y < height; ++y)
            for (int x = 0; x < width; ++x)
                p2[y][x] = Rgba (-1, -1, -1, -1);

        cout << "reading multiple tiles at a time," << flush;

        TiledRgbaInputFile in (fileName.c_str ());
        const Box2i&       dw = in.dataWindow ();

        assert (dw.max.x - dw.min.x + 1 == width);
        assert (dw.max.y - dw.min.y + 1 == height);
        assert (dw.min.x == 0);
        assert (dw.min.y == 0);

        in.setFrameBuffer (&p2[0][0], 1, width);

        for (int tileY = 0; tileY < in.numYTiles (); ++tileY)
        {
            bool tilesMissing = false;
            bool tilesBroken  = false;

            try
            {
                in.readTiles (0, in.numXTiles () - 1, tileY, tileY);
            }
            catch (const IEX_NAMESPACE::InputExc&)
            {
                tilesMissing = true;
            }
            catch (const IEX_NAMESPACE::IoExc&)
            {
                tilesBroken = true;
            }

            assert (tilesMissing || tilesBroken);
        }

        cout << " comparing" << endl << flush;

        for (int y = 0; y < height; ++y)
        {
            for (int x = 0; x < width; ++x)
            {
                const Rgba& s = p1[y][x];
                const Rgba& t = p2[y][x];

                assert (
                    (t.r == -1 && t.g == -1 && t.b == -1 && t.a == -1) ||
                    (t.r == s.r && t.g == s.g && t.b == s.b && t.a == s.a));
            }
        }
    }

    remove (fileName.c_str ());
}